

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  byte bVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  undefined4 uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  uint uVar48;
  ulong *puVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar63;
  float fVar64;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar103;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  ulong *local_1778;
  RTCFilterFunctionNArguments local_16d0;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  undefined8 local_1680;
  uint uStack_1678;
  uint uStack_1674;
  uint uStack_1670;
  uint uStack_166c;
  uint uStack_1668;
  uint uStack_1664;
  undefined8 local_1660;
  uint uStack_1658;
  uint uStack_1654;
  uint uStack_1650;
  uint uStack_164c;
  uint uStack_1648;
  uint uStack_1644;
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1400 [32];
  float local_13e0 [4];
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0 [4];
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar116 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(
                                                  fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_14e0._4_4_ = fVar3;
  local_14e0._0_4_ = fVar3;
  local_14e0._8_4_ = fVar3;
  local_14e0._12_4_ = fVar3;
  local_14e0._16_4_ = fVar3;
  local_14e0._20_4_ = fVar3;
  local_14e0._24_4_ = fVar3;
  local_14e0._28_4_ = fVar3;
  auVar91 = ZEXT3264(local_14e0);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1500._4_4_ = fVar4;
  local_1500._0_4_ = fVar4;
  local_1500._8_4_ = fVar4;
  local_1500._12_4_ = fVar4;
  local_1500._16_4_ = fVar4;
  local_1500._20_4_ = fVar4;
  local_1500._24_4_ = fVar4;
  local_1500._28_4_ = fVar4;
  auVar93 = ZEXT3264(local_1500);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_14c0._8_4_ = 0x80000000;
  local_14c0._0_8_ = 0x8000000080000000;
  local_14c0._12_4_ = 0x80000000;
  local_14c0._16_4_ = 0x80000000;
  local_14c0._20_4_ = 0x80000000;
  local_14c0._24_4_ = 0x80000000;
  local_14c0._28_4_ = 0x80000000;
  local_1520._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1520._8_4_ = -fVar2;
  local_1520._12_4_ = -fVar2;
  local_1520._16_4_ = -fVar2;
  local_1520._20_4_ = -fVar2;
  local_1520._24_4_ = -fVar2;
  local_1520._28_4_ = -fVar2;
  auVar97 = ZEXT3264(local_1520);
  local_1540._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_1540._8_4_ = -fVar3;
  local_1540._12_4_ = -fVar3;
  local_1540._16_4_ = -fVar3;
  local_1540._20_4_ = -fVar3;
  local_1540._24_4_ = -fVar3;
  local_1540._28_4_ = -fVar3;
  auVar99 = ZEXT3264(local_1540);
  iVar38 = (tray->tnear).field_0.i[k];
  local_1600._4_4_ = iVar38;
  local_1600._0_4_ = iVar38;
  local_1600._8_4_ = iVar38;
  local_1600._12_4_ = iVar38;
  local_1600._16_4_ = iVar38;
  local_1600._20_4_ = iVar38;
  local_1600._24_4_ = iVar38;
  local_1600._28_4_ = iVar38;
  auVar108 = ZEXT3264(local_1600);
  iVar38 = (tray->tfar).field_0.i[k];
  local_1620._4_4_ = iVar38;
  local_1620._0_4_ = iVar38;
  local_1620._8_4_ = iVar38;
  local_1620._12_4_ = iVar38;
  local_1620._16_4_ = iVar38;
  local_1620._20_4_ = iVar38;
  local_1620._24_4_ = iVar38;
  local_1620._28_4_ = iVar38;
  auVar111 = ZEXT3264(local_1620);
  local_1640._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  local_1640._8_4_ = -fVar4;
  local_1640._12_4_ = -fVar4;
  local_1640._16_4_ = -fVar4;
  local_1640._20_4_ = -fVar4;
  local_1640._24_4_ = -fVar4;
  local_1640._28_4_ = -fVar4;
  auVar115 = ZEXT3264(local_1640);
  local_1560._16_16_ = mm_lookupmask_ps._240_16_;
  local_1560._0_16_ = mm_lookupmask_ps._0_16_;
  iVar38 = 1 << ((uint)k & 0x1f);
  auVar102._4_4_ = iVar38;
  auVar102._0_4_ = iVar38;
  auVar102._8_4_ = iVar38;
  auVar102._12_4_ = iVar38;
  auVar102._16_4_ = iVar38;
  auVar102._20_4_ = iVar38;
  auVar102._24_4_ = iVar38;
  auVar102._28_4_ = iVar38;
  auVar59 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar102 = vpand_avx2(auVar102,auVar59);
  local_15a0 = vpcmpeqd_avx2(auVar102,auVar59);
  auVar59._8_4_ = 0xbf800000;
  auVar59._0_8_ = 0xbf800000bf800000;
  auVar59._12_4_ = 0xbf800000;
  auVar59._16_4_ = 0xbf800000;
  auVar59._20_4_ = 0xbf800000;
  auVar59._24_4_ = 0xbf800000;
  auVar59._28_4_ = 0xbf800000;
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = 0x3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar65._16_4_ = 0x3f800000;
  auVar65._20_4_ = 0x3f800000;
  auVar65._24_4_ = 0x3f800000;
  auVar65._28_4_ = 0x3f800000;
  _local_1580 = vblendvps_avx(auVar65,auVar59,local_1560);
  local_1778 = local_11f8;
LAB_016fc0f1:
  do {
    puVar49 = local_1778;
    if (puVar49 == &local_1200) {
LAB_016fcbcb:
      return puVar49 != &local_1200;
    }
    local_1778 = puVar49 + -1;
    uVar46 = puVar49[-1];
    while ((uVar46 & 8) == 0) {
      auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar50),auVar97._0_32_,
                                auVar116._0_32_);
      auVar25 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar51),auVar99._0_32_,
                                auVar91._0_32_);
      auVar102 = vpmaxsd_avx2(ZEXT1632(auVar58),ZEXT1632(auVar25));
      auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar53),auVar115._0_32_,
                                auVar93._0_32_);
      auVar25 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar50 ^ 0x20)),
                                auVar97._0_32_,auVar116._0_32_);
      auVar26 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar51 ^ 0x20)),
                                auVar99._0_32_,auVar91._0_32_);
      auVar65 = vpminsd_avx2(ZEXT1632(auVar25),ZEXT1632(auVar26));
      auVar25 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar53 ^ 0x20)),
                                auVar115._0_32_,auVar93._0_32_);
      auVar59 = vpmaxsd_avx2(ZEXT1632(auVar58),auVar108._0_32_);
      auVar102 = vpmaxsd_avx2(auVar102,auVar59);
      auVar59 = vpminsd_avx2(ZEXT1632(auVar25),auVar111._0_32_);
      auVar59 = vpminsd_avx2(auVar65,auVar59);
      auVar102 = vpcmpgtd_avx2(auVar102,auVar59);
      iVar38 = vmovmskps_avx(auVar102);
      if (iVar38 == 0xff) goto LAB_016fc0f1;
      bVar37 = ~(byte)iVar38;
      uVar39 = uVar46 & 0xfffffffffffffff0;
      lVar41 = 0;
      for (uVar46 = (ulong)bVar37; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
        lVar41 = lVar41 + 1;
      }
      uVar46 = *(ulong *)(uVar39 + lVar41 * 8);
      uVar42 = bVar37 - 1 & (uint)bVar37;
      uVar44 = (ulong)uVar42;
      if (uVar42 != 0) {
        do {
          *local_1778 = uVar46;
          local_1778 = local_1778 + 1;
          lVar41 = 0;
          for (uVar46 = uVar44; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
            lVar41 = lVar41 + 1;
          }
          uVar44 = uVar44 - 1 & uVar44;
          uVar46 = *(ulong *)(uVar39 + lVar41 * 8);
        } while (uVar44 != 0);
      }
    }
    uVar39 = uVar46 & 0xfffffffffffffff0;
    for (lVar41 = 0; lVar41 != (ulong)((uint)uVar46 & 0xf) - 8; lVar41 = lVar41 + 1) {
      lVar40 = lVar41 * 0x90;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(ulong *)(uVar39 + 0x40 + lVar40);
      auVar26 = vpmovzxbw_avx(auVar58);
      lVar1 = lVar40 + uVar39;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(uVar39 + 0x48 + lVar40);
      auVar58 = vpmovzxbw_avx(auVar25);
      auVar58 = vpminuw_avx(auVar26,auVar58);
      auVar58 = vpcmpeqw_avx(auVar26,auVar58);
      auVar58 = vpacksswb_avx(auVar58,auVar58);
      uVar43 = *(undefined4 *)(uVar39 + 0x70 + lVar40);
      auVar82._4_4_ = uVar43;
      auVar82._0_4_ = uVar43;
      auVar82._8_4_ = uVar43;
      auVar82._12_4_ = uVar43;
      auVar82._16_4_ = uVar43;
      auVar82._20_4_ = uVar43;
      auVar82._24_4_ = uVar43;
      auVar82._28_4_ = uVar43;
      uVar43 = *(undefined4 *)(uVar39 + 0x7c + lVar40);
      auVar85._4_4_ = uVar43;
      auVar85._0_4_ = uVar43;
      auVar85._8_4_ = uVar43;
      auVar85._12_4_ = uVar43;
      auVar85._16_4_ = uVar43;
      auVar85._20_4_ = uVar43;
      auVar85._24_4_ = uVar43;
      auVar85._28_4_ = uVar43;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)((uVar50 >> 2) + 0x40 + lVar1);
      auVar102 = vpmovzxbd_avx2(auVar26);
      auVar102 = vcvtdq2ps_avx(auVar102);
      auVar25 = vfmadd213ps_fma(auVar102,auVar85,auVar82);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(((uVar50 ^ 0x20) >> 2) + 0x40 + lVar1);
      auVar102 = vpmovzxbd_avx2(auVar6);
      auVar102 = vcvtdq2ps_avx(auVar102);
      auVar26 = vfmadd213ps_fma(auVar102,auVar85,auVar82);
      uVar43 = *(undefined4 *)(uVar39 + 0x74 + lVar40);
      auVar83._4_4_ = uVar43;
      auVar83._0_4_ = uVar43;
      auVar83._8_4_ = uVar43;
      auVar83._12_4_ = uVar43;
      auVar83._16_4_ = uVar43;
      auVar83._20_4_ = uVar43;
      auVar83._24_4_ = uVar43;
      auVar83._28_4_ = uVar43;
      uVar43 = *(undefined4 *)(uVar39 + 0x80 + lVar40);
      auVar86._4_4_ = uVar43;
      auVar86._0_4_ = uVar43;
      auVar86._8_4_ = uVar43;
      auVar86._12_4_ = uVar43;
      auVar86._16_4_ = uVar43;
      auVar86._20_4_ = uVar43;
      auVar86._24_4_ = uVar43;
      auVar86._28_4_ = uVar43;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((uVar51 >> 2) + 0x40 + lVar1);
      auVar102 = vpmovzxbd_avx2(auVar7);
      auVar102 = vcvtdq2ps_avx(auVar102);
      auVar6 = vfmadd213ps_fma(auVar102,auVar86,auVar83);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(((uVar51 ^ 0x20) >> 2) + 0x40 + lVar1);
      auVar102 = vpmovzxbd_avx2(auVar8);
      auVar102 = vcvtdq2ps_avx(auVar102);
      auVar7 = vfmadd213ps_fma(auVar102,auVar86,auVar83);
      uVar43 = *(undefined4 *)(uVar39 + 0x78 + lVar40);
      auVar84._4_4_ = uVar43;
      auVar84._0_4_ = uVar43;
      auVar84._8_4_ = uVar43;
      auVar84._12_4_ = uVar43;
      auVar84._16_4_ = uVar43;
      auVar84._20_4_ = uVar43;
      auVar84._24_4_ = uVar43;
      auVar84._28_4_ = uVar43;
      uVar43 = *(undefined4 *)(uVar39 + 0x84 + lVar40);
      auVar87._4_4_ = uVar43;
      auVar87._0_4_ = uVar43;
      auVar87._8_4_ = uVar43;
      auVar87._12_4_ = uVar43;
      auVar87._16_4_ = uVar43;
      auVar87._20_4_ = uVar43;
      auVar87._24_4_ = uVar43;
      auVar87._28_4_ = uVar43;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)((uVar53 >> 2) + 0x40 + lVar1);
      auVar102 = vpmovzxbd_avx2(auVar9);
      auVar102 = vcvtdq2ps_avx(auVar102);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(((uVar53 ^ 0x20) >> 2) + 0x40 + lVar1);
      auVar59 = vpmovzxbd_avx2(auVar10);
      auVar8 = vfmadd213ps_fma(auVar102,auVar87,auVar84);
      auVar102 = vcvtdq2ps_avx(auVar59);
      auVar9 = vfmadd213ps_fma(auVar102,auVar87,auVar84);
      auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar116._0_32_,auVar97._0_32_);
      auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar91._0_32_,auVar99._0_32_);
      auVar102 = vpmaxsd_avx2(ZEXT1632(auVar25),ZEXT1632(auVar6));
      auVar25 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar93._0_32_,auVar115._0_32_);
      auVar26 = vfmadd213ps_fma(ZEXT1632(auVar26),auVar116._0_32_,auVar97._0_32_);
      auVar6 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar91._0_32_,auVar99._0_32_);
      auVar65 = vpminsd_avx2(ZEXT1632(auVar26),ZEXT1632(auVar6));
      auVar26 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar93._0_32_,auVar115._0_32_);
      auVar59 = vpmaxsd_avx2(ZEXT1632(auVar25),auVar108._0_32_);
      auVar102 = vpmaxsd_avx2(auVar102,auVar59);
      auVar59 = vpminsd_avx2(ZEXT1632(auVar26),auVar111._0_32_);
      auVar59 = vpminsd_avx2(auVar65,auVar59);
      auVar102 = vpcmpgtd_avx2(auVar102,auVar59);
      uVar43 = vmovmskps_avx(auVar102);
      for (uVar44 = (ulong)(byte)(~(byte)uVar43 &
                                 (SUB161(auVar58 >> 7,0) & 1 | (SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar58 >> 0x3f,0) << 7)); uVar44 != 0;
          uVar44 = uVar44 - 1 & uVar44) {
        lVar40 = 0;
        for (uVar54 = uVar44; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
          lVar40 = lVar40 + 1;
        }
        uVar11 = *(ushort *)(lVar1 + lVar40 * 8);
        uVar12 = *(ushort *)(lVar1 + 2 + lVar40 * 8);
        uStack_1658 = *(uint *)(lVar1 + 0x88);
        uStack_1678 = *(uint *)(lVar1 + 4 + lVar40 * 8);
        pGVar13 = (context->scene->geometries).items[uStack_1658].ptr;
        lVar40 = *(long *)&pGVar13->field_0x58;
        lVar52 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)uStack_1678;
        uVar47 = uVar11 & 0x7fff;
        uVar48 = uVar12 & 0x7fff;
        uVar42 = *(uint *)(lVar40 + 4 + lVar52);
        uVar56 = (ulong)uVar42;
        uVar45 = (ulong)(uVar42 * uVar48 + *(int *)(lVar40 + lVar52) + uVar47);
        p_Var14 = pGVar13[1].intersectionFilterN;
        lVar15 = *(long *)&pGVar13[1].time_range.upper;
        auVar58 = *(undefined1 (*) [16])(lVar15 + (uVar45 + 1) * (long)p_Var14);
        auVar25 = *(undefined1 (*) [16])(lVar15 + (uVar45 + uVar56) * (long)p_Var14);
        lVar57 = uVar45 + uVar56 + 1;
        auVar26 = *(undefined1 (*) [16])(lVar15 + lVar57 * (long)p_Var14);
        auVar6 = *(undefined1 (*) [16])
                  (lVar15 + (uVar45 + (-1 < (short)uVar11) + 1) * (long)p_Var14);
        lVar55 = (ulong)(-1 < (short)uVar11) + lVar57;
        auVar7 = *(undefined1 (*) [16])(lVar15 + lVar55 * (long)p_Var14);
        uVar54 = 0;
        if (-1 < (short)uVar12) {
          uVar54 = uVar56;
        }
        auVar8 = *(undefined1 (*) [16])(lVar15 + (uVar45 + uVar56 + uVar54) * (long)p_Var14);
        auVar9 = *(undefined1 (*) [16])(lVar15 + (lVar57 + uVar54) * (long)p_Var14);
        auVar95._16_16_ = *(undefined1 (*) [16])(lVar15 + (uVar54 + lVar55) * (long)p_Var14);
        auVar95._0_16_ = auVar26;
        auVar88 = vunpcklps_avx(auVar58,auVar7);
        auVar10 = vunpckhps_avx(auVar58,auVar7);
        auVar94 = vunpcklps_avx(auVar6,auVar26);
        auVar6 = vunpckhps_avx(auVar6,auVar26);
        auVar16 = vunpcklps_avx(auVar10,auVar6);
        auVar17 = vunpcklps_avx(auVar88,auVar94);
        auVar6 = vunpckhps_avx(auVar88,auVar94);
        auVar88 = vunpcklps_avx(auVar25,auVar9);
        auVar10 = vunpckhps_avx(auVar25,auVar9);
        auVar94 = vunpcklps_avx(auVar26,auVar8);
        auVar8 = vunpckhps_avx(auVar26,auVar8);
        auVar10 = vunpcklps_avx(auVar10,auVar8);
        auVar18 = vunpcklps_avx(auVar88,auVar94);
        auVar8 = vunpckhps_avx(auVar88,auVar94);
        auVar77._16_16_ = auVar9;
        auVar77._0_16_ = auVar25;
        auVar66._16_16_ = auVar7;
        auVar66._0_16_ = auVar58;
        auVar102 = vunpcklps_avx(auVar66,auVar77);
        auVar60._16_16_ = auVar26;
        auVar60._0_16_ = *(undefined1 (*) [16])(lVar15 + (long)p_Var14 * uVar45);
        auVar59 = vunpcklps_avx(auVar60,auVar95);
        auVar85 = vunpcklps_avx(auVar59,auVar102);
        auVar86 = vunpckhps_avx(auVar59,auVar102);
        auVar102 = vunpckhps_avx(auVar66,auVar77);
        auVar59 = vunpckhps_avx(auVar60,auVar95);
        auVar87 = vunpcklps_avx(auVar59,auVar102);
        auVar61._16_16_ = auVar17;
        auVar61._0_16_ = auVar17;
        auVar78._16_16_ = auVar6;
        auVar78._0_16_ = auVar6;
        auVar89._16_16_ = auVar16;
        auVar89._0_16_ = auVar16;
        auVar92._16_16_ = auVar18;
        auVar92._0_16_ = auVar18;
        auVar100._16_16_ = auVar8;
        auVar100._0_16_ = auVar8;
        auVar104._16_16_ = auVar10;
        auVar104._0_16_ = auVar10;
        auVar59 = vsubps_avx(auVar85,auVar61);
        auVar102 = vsubps_avx(auVar86,auVar78);
        auVar65 = vsubps_avx(auVar87,auVar89);
        auVar82 = vsubps_avx(auVar92,auVar85);
        auVar83 = vsubps_avx(auVar100,auVar86);
        auVar84 = vsubps_avx(auVar104,auVar87);
        auVar27._4_4_ = auVar102._4_4_ * auVar84._4_4_;
        auVar27._0_4_ = auVar102._0_4_ * auVar84._0_4_;
        auVar27._8_4_ = auVar102._8_4_ * auVar84._8_4_;
        auVar27._12_4_ = auVar102._12_4_ * auVar84._12_4_;
        auVar27._16_4_ = auVar102._16_4_ * auVar84._16_4_;
        auVar27._20_4_ = auVar102._20_4_ * auVar84._20_4_;
        auVar27._24_4_ = auVar102._24_4_ * auVar84._24_4_;
        auVar27._28_4_ = auVar17._12_4_;
        auVar7 = vfmsub231ps_fma(auVar27,auVar83,auVar65);
        uVar43 = *(undefined4 *)(ray + k * 4);
        auVar106._4_4_ = uVar43;
        auVar106._0_4_ = uVar43;
        auVar106._8_4_ = uVar43;
        auVar106._12_4_ = uVar43;
        auVar106._16_4_ = uVar43;
        auVar106._20_4_ = uVar43;
        auVar106._24_4_ = uVar43;
        auVar106._28_4_ = uVar43;
        uVar43 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar109._4_4_ = uVar43;
        auVar109._0_4_ = uVar43;
        auVar109._8_4_ = uVar43;
        auVar109._12_4_ = uVar43;
        auVar109._16_4_ = uVar43;
        auVar109._20_4_ = uVar43;
        auVar109._24_4_ = uVar43;
        auVar109._28_4_ = uVar43;
        uVar43 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar112._4_4_ = uVar43;
        auVar112._0_4_ = uVar43;
        auVar112._8_4_ = uVar43;
        auVar112._12_4_ = uVar43;
        auVar112._16_4_ = uVar43;
        auVar112._20_4_ = uVar43;
        auVar112._24_4_ = uVar43;
        auVar112._28_4_ = uVar43;
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar101._4_4_ = fVar2;
        auVar101._0_4_ = fVar2;
        auVar101._8_4_ = fVar2;
        auVar101._12_4_ = fVar2;
        auVar101._16_4_ = fVar2;
        auVar101._20_4_ = fVar2;
        auVar101._24_4_ = fVar2;
        auVar101._28_4_ = fVar2;
        auVar28._4_4_ = auVar65._4_4_ * auVar82._4_4_;
        auVar28._0_4_ = auVar65._0_4_ * auVar82._0_4_;
        auVar28._8_4_ = auVar65._8_4_ * auVar82._8_4_;
        auVar28._12_4_ = auVar65._12_4_ * auVar82._12_4_;
        auVar28._16_4_ = auVar65._16_4_ * auVar82._16_4_;
        auVar28._20_4_ = auVar65._20_4_ * auVar82._20_4_;
        auVar28._24_4_ = auVar65._24_4_ * auVar82._24_4_;
        auVar28._28_4_ = auVar6._12_4_;
        auVar85 = vsubps_avx(auVar85,auVar106);
        fVar3 = *(float *)(ray + k * 4 + 0xa0);
        auVar107._4_4_ = fVar3;
        auVar107._0_4_ = fVar3;
        auVar107._8_4_ = fVar3;
        auVar107._12_4_ = fVar3;
        auVar107._16_4_ = fVar3;
        auVar107._20_4_ = fVar3;
        auVar107._24_4_ = fVar3;
        auVar107._28_4_ = fVar3;
        auVar6 = vfmsub231ps_fma(auVar28,auVar84,auVar59);
        auVar86 = vsubps_avx(auVar86,auVar109);
        fVar4 = *(float *)(ray + k * 4 + 0xc0);
        auVar110._4_4_ = fVar4;
        auVar110._0_4_ = fVar4;
        auVar110._8_4_ = fVar4;
        auVar110._12_4_ = fVar4;
        auVar110._16_4_ = fVar4;
        auVar110._20_4_ = fVar4;
        auVar110._24_4_ = fVar4;
        auVar110._28_4_ = fVar4;
        auVar87 = vsubps_avx(auVar87,auVar112);
        auVar29._4_4_ = fVar2 * auVar86._4_4_;
        auVar29._0_4_ = fVar2 * auVar86._0_4_;
        auVar29._8_4_ = fVar2 * auVar86._8_4_;
        auVar29._12_4_ = fVar2 * auVar86._12_4_;
        auVar29._16_4_ = fVar2 * auVar86._16_4_;
        auVar29._20_4_ = fVar2 * auVar86._20_4_;
        auVar29._24_4_ = fVar2 * auVar86._24_4_;
        auVar29._28_4_ = uVar43;
        auVar58 = vfmsub231ps_fma(auVar29,auVar85,auVar107);
        auVar30._4_4_ = auVar84._4_4_ * auVar58._4_4_;
        auVar30._0_4_ = auVar84._0_4_ * auVar58._0_4_;
        auVar30._8_4_ = auVar84._8_4_ * auVar58._8_4_;
        auVar30._12_4_ = auVar84._12_4_ * auVar58._12_4_;
        auVar30._16_4_ = auVar84._16_4_ * 0.0;
        auVar30._20_4_ = auVar84._20_4_ * 0.0;
        auVar30._24_4_ = auVar84._24_4_ * 0.0;
        auVar30._28_4_ = auVar84._28_4_;
        auVar31._4_4_ = auVar65._4_4_ * auVar58._4_4_;
        auVar31._0_4_ = auVar65._0_4_ * auVar58._0_4_;
        auVar31._8_4_ = auVar65._8_4_ * auVar58._8_4_;
        auVar31._12_4_ = auVar65._12_4_ * auVar58._12_4_;
        auVar31._16_4_ = auVar65._16_4_ * 0.0;
        auVar31._20_4_ = auVar65._20_4_ * 0.0;
        auVar31._24_4_ = auVar65._24_4_ * 0.0;
        auVar31._28_4_ = auVar65._28_4_;
        auVar113._0_4_ = fVar4 * auVar85._0_4_;
        auVar113._4_4_ = fVar4 * auVar85._4_4_;
        auVar113._8_4_ = fVar4 * auVar85._8_4_;
        auVar113._12_4_ = fVar4 * auVar85._12_4_;
        auVar113._16_4_ = fVar4 * auVar85._16_4_;
        auVar113._20_4_ = fVar4 * auVar85._20_4_;
        auVar113._24_4_ = fVar4 * auVar85._24_4_;
        auVar113._28_4_ = 0;
        auVar25 = vfmsub231ps_fma(auVar113,auVar87,auVar101);
        auVar58 = vfmadd231ps_fma(auVar30,ZEXT1632(auVar25),auVar83);
        auVar25 = vfmadd231ps_fma(auVar31,auVar102,ZEXT1632(auVar25));
        auVar32._4_4_ = auVar59._4_4_ * auVar83._4_4_;
        auVar32._0_4_ = auVar59._0_4_ * auVar83._0_4_;
        auVar32._8_4_ = auVar59._8_4_ * auVar83._8_4_;
        auVar32._12_4_ = auVar59._12_4_ * auVar83._12_4_;
        auVar32._16_4_ = auVar59._16_4_ * auVar83._16_4_;
        auVar32._20_4_ = auVar59._20_4_ * auVar83._20_4_;
        auVar32._24_4_ = auVar59._24_4_ * auVar83._24_4_;
        auVar32._28_4_ = auVar83._28_4_;
        auVar26 = vfmsub231ps_fma(auVar32,auVar82,auVar102);
        auVar114._0_4_ = fVar3 * auVar87._0_4_;
        auVar114._4_4_ = fVar3 * auVar87._4_4_;
        auVar114._8_4_ = fVar3 * auVar87._8_4_;
        auVar114._12_4_ = fVar3 * auVar87._12_4_;
        auVar114._16_4_ = fVar3 * auVar87._16_4_;
        auVar114._20_4_ = fVar3 * auVar87._20_4_;
        auVar114._24_4_ = fVar3 * auVar87._24_4_;
        auVar114._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar114,auVar86,auVar110);
        fVar2 = auVar26._0_4_;
        fVar3 = auVar26._4_4_;
        auVar33._4_4_ = fVar4 * fVar3;
        auVar33._0_4_ = fVar4 * fVar2;
        fVar64 = auVar26._8_4_;
        auVar33._8_4_ = fVar4 * fVar64;
        fVar69 = auVar26._12_4_;
        auVar33._12_4_ = fVar4 * fVar69;
        auVar33._16_4_ = fVar4 * 0.0;
        auVar33._20_4_ = fVar4 * 0.0;
        auVar33._24_4_ = fVar4 * 0.0;
        auVar33._28_4_ = fVar4;
        auVar26 = vfmadd231ps_fma(auVar33,ZEXT1632(auVar6),auVar107);
        auVar108 = ZEXT3264(local_1600);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),ZEXT1632(auVar7),auVar101);
        auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar8),auVar82);
        auVar102 = vandps_avx(ZEXT1632(auVar26),local_14c0);
        uVar42 = auVar102._0_4_;
        auVar96._0_4_ = (float)(auVar58._0_4_ ^ uVar42);
        uVar19 = auVar102._4_4_;
        auVar96._4_4_ = (float)(auVar58._4_4_ ^ uVar19);
        uVar20 = auVar102._8_4_;
        auVar96._8_4_ = (float)(auVar58._8_4_ ^ uVar20);
        uVar21 = auVar102._12_4_;
        auVar96._12_4_ = (float)(auVar58._12_4_ ^ uVar21);
        fVar4 = auVar102._16_4_;
        auVar96._16_4_ = fVar4;
        fVar22 = auVar102._20_4_;
        auVar96._20_4_ = fVar22;
        fVar23 = auVar102._24_4_;
        auVar96._24_4_ = fVar23;
        fVar24 = auVar102._28_4_;
        auVar96._28_4_ = fVar24;
        auVar58 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar59,ZEXT1632(auVar8));
        auVar115 = ZEXT3264(local_1640);
        auVar98._0_4_ = (float)(auVar58._0_4_ ^ uVar42);
        auVar98._4_4_ = (float)(auVar58._4_4_ ^ uVar19);
        auVar98._8_4_ = (float)(auVar58._8_4_ ^ uVar20);
        auVar98._12_4_ = (float)(auVar58._12_4_ ^ uVar21);
        auVar98._16_4_ = fVar4;
        auVar98._20_4_ = fVar22;
        auVar98._24_4_ = fVar23;
        auVar98._28_4_ = fVar24;
        auVar102 = vcmpps_avx(auVar96,ZEXT832(0) << 0x20,5);
        auVar59 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,5);
        auVar102 = vandps_avx(auVar59,auVar102);
        auVar67._8_4_ = 0x7fffffff;
        auVar67._0_8_ = 0x7fffffff7fffffff;
        auVar67._12_4_ = 0x7fffffff;
        auVar67._16_4_ = 0x7fffffff;
        auVar67._20_4_ = 0x7fffffff;
        auVar67._24_4_ = 0x7fffffff;
        auVar67._28_4_ = 0x7fffffff;
        local_1440 = vandps_avx(ZEXT1632(auVar26),auVar67);
        auVar59 = vcmpps_avx(ZEXT1632(auVar26),ZEXT832(0) << 0x20,4);
        auVar111 = ZEXT3264(local_1620);
        auVar102 = vandps_avx(auVar102,auVar59);
        auVar105._0_4_ = auVar96._0_4_ + auVar98._0_4_;
        auVar105._4_4_ = auVar96._4_4_ + auVar98._4_4_;
        auVar105._8_4_ = auVar96._8_4_ + auVar98._8_4_;
        auVar105._12_4_ = auVar96._12_4_ + auVar98._12_4_;
        auVar105._16_4_ = fVar4 + fVar4;
        auVar105._20_4_ = fVar22 + fVar22;
        auVar105._24_4_ = fVar23 + fVar23;
        auVar105._28_4_ = fVar24 + fVar24;
        auVar59 = vcmpps_avx(auVar105,local_1440,2);
        auVar65 = auVar59 & auVar102;
        if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar65 >> 0x7f,0) != '\0') ||
              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar65 >> 0xbf,0) != '\0') ||
            (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar65[0x1f] < '\0') {
          auVar102 = vandps_avx(auVar102,auVar59);
          auVar58 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
          auVar34._4_4_ = fVar3 * auVar87._4_4_;
          auVar34._0_4_ = fVar2 * auVar87._0_4_;
          auVar34._8_4_ = fVar64 * auVar87._8_4_;
          auVar34._12_4_ = fVar69 * auVar87._12_4_;
          auVar34._16_4_ = auVar87._16_4_ * 0.0;
          auVar34._20_4_ = auVar87._20_4_ * 0.0;
          auVar34._24_4_ = auVar87._24_4_ * 0.0;
          auVar34._28_4_ = auVar87._28_4_;
          auVar25 = vfmadd213ps_fma(auVar86,ZEXT1632(auVar6),auVar34);
          auVar25 = vfmadd213ps_fma(auVar85,ZEXT1632(auVar7),ZEXT1632(auVar25));
          local_1460._0_4_ = (float)(uVar42 ^ auVar25._0_4_);
          local_1460._4_4_ = (float)(uVar19 ^ auVar25._4_4_);
          local_1460._8_4_ = (float)(uVar20 ^ auVar25._8_4_);
          local_1460._12_4_ = (float)(uVar21 ^ auVar25._12_4_);
          local_1460._16_4_ = fVar4;
          local_1460._20_4_ = fVar22;
          local_1460._24_4_ = fVar23;
          local_1460._28_4_ = fVar24;
          fVar103 = *(float *)(ray + k * 4 + 0x60);
          fVar63 = local_1440._0_4_;
          fVar68 = local_1440._4_4_;
          auVar35._4_4_ = fVar68 * fVar103;
          auVar35._0_4_ = fVar63 * fVar103;
          fVar70 = local_1440._8_4_;
          auVar35._8_4_ = fVar70 * fVar103;
          fVar72 = local_1440._12_4_;
          auVar35._12_4_ = fVar72 * fVar103;
          fVar74 = local_1440._16_4_;
          auVar35._16_4_ = fVar74 * fVar103;
          fVar75 = local_1440._20_4_;
          auVar35._20_4_ = fVar75 * fVar103;
          fVar76 = local_1440._24_4_;
          auVar35._24_4_ = fVar76 * fVar103;
          auVar35._28_4_ = fVar103;
          auVar102 = vcmpps_avx(auVar35,local_1460,1);
          fVar103 = *(float *)(ray + k * 4 + 0x100);
          auVar36._4_4_ = fVar68 * fVar103;
          auVar36._0_4_ = fVar63 * fVar103;
          auVar36._8_4_ = fVar70 * fVar103;
          auVar36._12_4_ = fVar72 * fVar103;
          auVar36._16_4_ = fVar74 * fVar103;
          auVar36._20_4_ = fVar75 * fVar103;
          auVar36._24_4_ = fVar76 * fVar103;
          auVar36._28_4_ = auVar87._28_4_;
          auVar59 = vcmpps_avx(local_1460,auVar36,2);
          auVar102 = vandps_avx(auVar102,auVar59);
          auVar25 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
          auVar58 = vpand_avx(auVar58,auVar25);
          auVar102 = vpmovzxwd_avx2(auVar58);
          auVar102 = vpslld_avx2(auVar102,0x1f);
          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar102 >> 0x7f,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0xbf,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar102[0x1f] < '\0') {
            auVar59 = vsubps_avx(local_1440,auVar98);
            local_14a0 = vblendvps_avx(auVar96,auVar59,local_1560);
            auVar59 = vsubps_avx(local_1440,auVar96);
            local_1480 = vblendvps_avx(auVar98,auVar59,local_1560);
            local_1400 = vpsrad_avx2(auVar102,0x1f);
            local_1380._0_4_ = (float)local_1580._0_4_ * auVar7._0_4_;
            local_1380._4_4_ = (float)local_1580._4_4_ * auVar7._4_4_;
            local_1380._8_4_ = fStack_1578 * auVar7._8_4_;
            local_1380._12_4_ = fStack_1574 * auVar7._12_4_;
            local_1380._16_4_ = fStack_1570 * 0.0;
            local_1380._20_4_ = fStack_156c * 0.0;
            local_1380._24_4_ = fStack_1568 * 0.0;
            local_1380._28_4_ = 0;
            local_1360._4_4_ = (float)local_1580._4_4_ * auVar6._4_4_;
            local_1360._0_4_ = (float)local_1580._0_4_ * auVar6._0_4_;
            local_1360._8_4_ = fStack_1578 * auVar6._8_4_;
            local_1360._12_4_ = fStack_1574 * auVar6._12_4_;
            local_1360._16_4_ = fStack_1570 * 0.0;
            local_1360._20_4_ = fStack_156c * 0.0;
            local_1360._24_4_ = fStack_1568 * 0.0;
            local_1360._28_4_ = 0;
            local_1340._4_4_ = (float)local_1580._4_4_ * fVar3;
            local_1340._0_4_ = (float)local_1580._0_4_ * fVar2;
            local_1340._8_4_ = fStack_1578 * fVar64;
            local_1340._12_4_ = fStack_1574 * fVar69;
            local_1340._16_4_ = fStack_1570 * 0.0;
            local_1340._20_4_ = fStack_156c * 0.0;
            local_1340._24_4_ = fStack_1568 * 0.0;
            local_1340._28_4_ = 0;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_016fcbb1:
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_016fcbcb;
              }
              auVar62._0_8_ = (ulong)CONCAT24(uVar11,(uint)uVar11) & 0x7fff00007fff;
              auVar62._8_4_ = uVar47;
              auVar62._12_4_ = uVar47;
              auVar62._16_4_ = uVar47;
              auVar62._20_4_ = uVar47;
              auVar62._24_4_ = uVar47;
              auVar62._28_4_ = uVar47;
              auVar102 = vpaddd_avx2(auVar62,_DAT_01fb7740);
              auVar79._0_8_ = (ulong)CONCAT24(uVar12,(uint)uVar12) & 0x7fff00007fff;
              auVar79._8_4_ = uVar48;
              auVar79._12_4_ = uVar48;
              auVar79._16_4_ = uVar48;
              auVar79._20_4_ = uVar48;
              auVar79._24_4_ = uVar48;
              auVar79._28_4_ = uVar48;
              auVar59 = vpaddd_avx2(auVar79,_DAT_01fb7760);
              auVar88._0_4_ = (float)(int)(*(ushort *)(lVar40 + 8 + lVar52) - 1);
              auVar88._4_12_ = auVar116._4_12_;
              auVar25 = vrcpss_avx(auVar88,auVar88);
              auVar26 = vfnmadd213ss_fma(auVar88,auVar25,SUB6416(ZEXT464(0x40000000),0));
              fVar2 = auVar25._0_4_ * auVar26._0_4_;
              auVar94._0_4_ = (float)(int)(*(ushort *)(lVar40 + 10 + lVar52) - 1);
              auVar94._4_12_ = auVar116._4_12_;
              auVar25 = vrcpss_avx(auVar94,auVar94);
              auVar26 = vfnmadd213ss_fma(auVar94,auVar25,SUB6416(ZEXT464(0x40000000),0));
              fVar3 = auVar25._0_4_ * auVar26._0_4_;
              auVar102 = vcvtdq2ps_avx(auVar102);
              fStack_13c4 = auVar102._28_4_ + local_14a0._28_4_;
              auVar59 = vcvtdq2ps_avx(auVar59);
              auVar65 = vrcpps_avx(local_1440);
              auVar90._8_4_ = 0x3f800000;
              auVar90._0_8_ = 0x3f8000003f800000;
              auVar90._12_4_ = 0x3f800000;
              auVar90._16_4_ = 0x3f800000;
              auVar90._20_4_ = 0x3f800000;
              auVar90._24_4_ = 0x3f800000;
              auVar90._28_4_ = 0x3f800000;
              auVar25 = vfnmadd213ps_fma(local_1440,auVar65,auVar90);
              auVar25 = vfmadd132ps_fma(ZEXT1632(auVar25),auVar65,auVar65);
              fVar64 = auVar25._0_4_;
              fVar69 = auVar25._4_4_;
              local_13a0._4_4_ = fVar69 * local_1460._4_4_;
              local_13a0._0_4_ = fVar64 * local_1460._0_4_;
              fVar71 = auVar25._8_4_;
              local_13a0._8_4_ = fVar71 * local_1460._8_4_;
              fVar73 = auVar25._12_4_;
              local_13a0._12_4_ = fVar73 * local_1460._12_4_;
              local_13a0._16_4_ = fVar4 * 0.0;
              local_13a0._20_4_ = fVar22 * 0.0;
              local_13a0._24_4_ = fVar23 * 0.0;
              local_13a0._28_4_ = fVar24;
              local_13e0[0] = (fVar63 * auVar102._0_4_ + local_14a0._0_4_) * fVar2 * fVar64;
              local_13e0[1] = (fVar68 * auVar102._4_4_ + local_14a0._4_4_) * fVar2 * fVar69;
              local_13e0[2] = (fVar70 * auVar102._8_4_ + local_14a0._8_4_) * fVar2 * fVar71;
              local_13e0[3] = (fVar72 * auVar102._12_4_ + local_14a0._12_4_) * fVar2 * fVar73;
              fStack_13d0 = (fVar74 * auVar102._16_4_ + local_14a0._16_4_) * fVar2 * 0.0;
              fStack_13cc = (fVar75 * auVar102._20_4_ + local_14a0._20_4_) * fVar2 * 0.0;
              fStack_13c8 = (fVar76 * auVar102._24_4_ + local_14a0._24_4_) * fVar2 * 0.0;
              local_13c0[0] = (fVar63 * auVar59._0_4_ + local_1480._0_4_) * fVar3 * fVar64;
              local_13c0[1] = (fVar68 * auVar59._4_4_ + local_1480._4_4_) * fVar3 * fVar69;
              local_13c0[2] = (fVar70 * auVar59._8_4_ + local_1480._8_4_) * fVar3 * fVar71;
              local_13c0[3] = (fVar72 * auVar59._12_4_ + local_1480._12_4_) * fVar3 * fVar73;
              fStack_13b0 = (fVar74 * auVar59._16_4_ + local_1480._16_4_) * fVar3 * 0.0;
              fStack_13ac = (fVar75 * auVar59._20_4_ + local_1480._20_4_) * fVar3 * 0.0;
              fStack_13a8 = (fVar76 * auVar59._24_4_ + local_1480._24_4_) * fVar3 * 0.0;
              fStack_13a4 = fStack_13c4;
              auVar58 = vpsllw_avx(auVar58,0xf);
              auVar58 = vpacksswb_avx(auVar58,auVar58);
              uVar54 = 0;
              uVar56 = (ulong)(byte)(SUB161(auVar58 >> 7,0) & 1 |
                                     (SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar58 >> 0x3f,0) << 7);
              for (uVar45 = uVar56; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                uVar54 = uVar54 + 1;
              }
              local_1660 = CONCAT44(uStack_1658,uStack_1658);
              local_1680 = CONCAT44(uStack_1678,uStack_1678);
              local_15c0 = auVar116._0_32_;
              local_16a0 = fVar103;
              fStack_169c = fVar103;
              fStack_1698 = fVar103;
              fStack_1694 = fVar103;
              fStack_1690 = fVar103;
              fStack_168c = fVar103;
              fStack_1688 = fVar103;
              fStack_1684 = fVar103;
              uStack_1674 = uStack_1678;
              uStack_1670 = uStack_1678;
              uStack_166c = uStack_1678;
              uStack_1668 = uStack_1678;
              uStack_1664 = uStack_1678;
              uStack_1654 = uStack_1658;
              uStack_1650 = uStack_1658;
              uStack_164c = uStack_1658;
              uStack_1648 = uStack_1658;
              uStack_1644 = uStack_1658;
              while (uVar56 != 0) {
                local_12c0 = local_13e0[uVar54];
                local_12a0 = local_13c0[uVar54];
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_13a0 + uVar54 * 4);
                uVar43 = *(undefined4 *)(local_1380 + uVar54 * 4);
                auVar80._4_4_ = uVar43;
                auVar80._0_4_ = uVar43;
                auVar80._8_4_ = uVar43;
                auVar80._12_4_ = uVar43;
                auVar80._16_4_ = uVar43;
                auVar80._20_4_ = uVar43;
                auVar80._24_4_ = uVar43;
                auVar80._28_4_ = uVar43;
                uVar5 = *(undefined4 *)(local_1360 + uVar54 * 4);
                local_1300._4_4_ = uVar5;
                local_1300._0_4_ = uVar5;
                local_1300._8_4_ = uVar5;
                local_1300._12_4_ = uVar5;
                local_1300._16_4_ = uVar5;
                local_1300._20_4_ = uVar5;
                local_1300._24_4_ = uVar5;
                local_1300._28_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_1340 + uVar54 * 4);
                local_12e0._4_4_ = uVar5;
                local_12e0._0_4_ = uVar5;
                local_12e0._8_4_ = uVar5;
                local_12e0._12_4_ = uVar5;
                local_12e0._16_4_ = uVar5;
                local_12e0._20_4_ = uVar5;
                local_12e0._24_4_ = uVar5;
                local_12e0._28_4_ = uVar5;
                local_16d0.context = context->user;
                local_1320[0] = (RTCHitN)(char)uVar43;
                local_1320[1] = (RTCHitN)(char)((uint)uVar43 >> 8);
                local_1320[2] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                local_1320[3] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                local_1320[4] = (RTCHitN)(char)uVar43;
                local_1320[5] = (RTCHitN)(char)((uint)uVar43 >> 8);
                local_1320[6] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                local_1320[7] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                local_1320[8] = (RTCHitN)(char)uVar43;
                local_1320[9] = (RTCHitN)(char)((uint)uVar43 >> 8);
                local_1320[10] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                local_1320[0xb] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                local_1320[0xc] = (RTCHitN)(char)uVar43;
                local_1320[0xd] = (RTCHitN)(char)((uint)uVar43 >> 8);
                local_1320[0xe] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                local_1320[0xf] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                local_1320[0x10] = (RTCHitN)(char)uVar43;
                local_1320[0x11] = (RTCHitN)(char)((uint)uVar43 >> 8);
                local_1320[0x12] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                local_1320[0x13] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                local_1320[0x14] = (RTCHitN)(char)uVar43;
                local_1320[0x15] = (RTCHitN)(char)((uint)uVar43 >> 8);
                local_1320[0x16] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                local_1320[0x17] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                local_1320[0x18] = (RTCHitN)(char)uVar43;
                local_1320[0x19] = (RTCHitN)(char)((uint)uVar43 >> 8);
                local_1320[0x1a] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                local_1320[0x1b] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                local_1320[0x1c] = (RTCHitN)(char)uVar43;
                local_1320[0x1d] = (RTCHitN)(char)((uint)uVar43 >> 8);
                local_1320[0x1e] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
                local_1320[0x1f] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
                fStack_12bc = local_12c0;
                fStack_12b8 = local_12c0;
                fStack_12b4 = local_12c0;
                fStack_12b0 = local_12c0;
                fStack_12ac = local_12c0;
                fStack_12a8 = local_12c0;
                fStack_12a4 = local_12c0;
                fStack_129c = local_12a0;
                fStack_1298 = local_12a0;
                fStack_1294 = local_12a0;
                fStack_1290 = local_12a0;
                fStack_128c = local_12a0;
                fStack_1288 = local_12a0;
                fStack_1284 = local_12a0;
                local_1280 = local_1680;
                uStack_1278 = CONCAT44(uStack_1674,uStack_1678);
                uStack_1270 = CONCAT44(uStack_166c,uStack_1670);
                uStack_1268 = CONCAT44(uStack_1664,uStack_1668);
                local_1260 = local_1660;
                uStack_1258 = CONCAT44(uStack_1654,uStack_1658);
                uStack_1250 = CONCAT44(uStack_164c,uStack_1650);
                uStack_1248 = CONCAT44(uStack_1644,uStack_1648);
                auVar102 = vpcmpeqd_avx2(auVar80,auVar80);
                uStack_123c = (local_16d0.context)->instID[0];
                local_1240 = uStack_123c;
                uStack_1238 = uStack_123c;
                uStack_1234 = uStack_123c;
                uStack_1230 = uStack_123c;
                uStack_122c = uStack_123c;
                uStack_1228 = uStack_123c;
                uStack_1224 = uStack_123c;
                uStack_121c = (local_16d0.context)->instPrimID[0];
                local_1220 = uStack_121c;
                uStack_1218 = uStack_121c;
                uStack_1214 = uStack_121c;
                uStack_1210 = uStack_121c;
                uStack_120c = uStack_121c;
                uStack_1208 = uStack_121c;
                uStack_1204 = uStack_121c;
                local_15e0 = local_15a0;
                local_16d0.valid = (int *)local_15e0;
                local_16d0.geometryUserPtr = pGVar13->userPtr;
                local_16d0.hit = local_1320;
                local_16d0.N = 8;
                local_16d0.ray = (RTCRayN *)ray;
                if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar102 = ZEXT1632(auVar102._0_16_);
                  (*pGVar13->occlusionFilterN)(&local_16d0);
                  auVar102 = vpcmpeqd_avx2(auVar102,auVar102);
                  auVar115 = ZEXT3264(local_1640);
                  auVar111 = ZEXT3264(local_1620);
                  auVar108 = ZEXT3264(local_1600);
                  auVar116 = ZEXT3264(local_15c0);
                  fVar103 = local_16a0;
                }
                auVar65 = vpcmpeqd_avx2(local_15e0,_DAT_01f7b000);
                auVar59 = auVar102 & ~auVar65;
                if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar59 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar59 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar59 >> 0x7f,0) == '\0') &&
                      (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar59 >> 0xbf,0) == '\0') &&
                    (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar59[0x1f]) {
                  auVar65 = auVar65 ^ auVar102;
                }
                else {
                  p_Var14 = context->args->filter;
                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar102 = ZEXT1632(auVar102._0_16_);
                    (*p_Var14)(&local_16d0);
                    auVar102 = vpcmpeqd_avx2(auVar102,auVar102);
                    auVar115 = ZEXT3264(local_1640);
                    auVar111 = ZEXT3264(local_1620);
                    auVar108 = ZEXT3264(local_1600);
                    auVar116 = ZEXT3264(local_15c0);
                    fVar103 = local_16a0;
                  }
                  auVar59 = vpcmpeqd_avx2(local_15e0,_DAT_01f7b000);
                  auVar65 = auVar59 ^ auVar102;
                  auVar81._8_4_ = 0xff800000;
                  auVar81._0_8_ = 0xff800000ff800000;
                  auVar81._12_4_ = 0xff800000;
                  auVar81._16_4_ = 0xff800000;
                  auVar81._20_4_ = 0xff800000;
                  auVar81._24_4_ = 0xff800000;
                  auVar81._28_4_ = 0xff800000;
                  auVar102 = vblendvps_avx(auVar81,*(undefined1 (*) [32])(local_16d0.ray + 0x100),
                                           auVar59);
                  *(undefined1 (*) [32])(local_16d0.ray + 0x100) = auVar102;
                }
                if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar65 >> 0x7f,0) != '\0') ||
                      (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar65 >> 0xbf,0) != '\0') ||
                    (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar65[0x1f] < '\0') goto LAB_016fcbb1;
                *(float *)(ray + k * 4 + 0x100) = fVar103;
                uVar45 = uVar54 & 0x3f;
                uVar54 = 0;
                uVar56 = uVar56 ^ 1L << uVar45;
                for (uVar45 = uVar56; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000)
                {
                  uVar54 = uVar54 + 1;
                }
              }
            }
          }
        }
      }
      auVar91 = ZEXT3264(local_14e0);
      auVar93 = ZEXT3264(local_1500);
      auVar97 = ZEXT3264(local_1520);
      auVar99 = ZEXT3264(local_1540);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }